

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void __thiscall LTChannel::Stop(LTChannel *this,bool bWaitJoin)

{
  if ((this->thr)._M_id._M_thread != 0) {
    if ((int)this->eThrStatus < 3) {
      this->eThrStatus = THR_STOP;
    }
    if (bWaitJoin) {
      std::thread::join();
      if ((this->thr)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->thr)._M_id._M_thread = 0;
      this->eThrStatus = THR_NONE;
    }
  }
  return;
}

Assistant:

int LTFlightDataChannel::GetNumAcServed () const
{
    // only try to re-count every second, and needs the mapFd lock
    if (timeLastAcCnt + 1.0f < dataRefs.GetMiscNetwTime()) {
        std::unique_lock<std::mutex> lockFd(mapFdMutex, std::try_to_lock);
        if (lockFd) {
            timeLastAcCnt = dataRefs.GetMiscNetwTime();
            numAcServed = 0;                // start counting flight data served by _this_ channel
            for (const mapLTFlightDataTy::value_type& p: mapFd) {
                const LTChannel* pCh = nullptr;
                if (p.second.GetCurrChannel(pCh) && pCh == this)
                    ++numAcServed;
            }
        }
    }

    // return whatever we know
    return numAcServed;
}